

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>,_bool>
* __thiscall
phmap::priv::
btree_set_container<phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>>
::
emplace<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor>
          (pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>,_bool>
           *__return_storage_ptr__,void *this,NoDefaultCtor *args,NoDefaultCtor *args_1)

{
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
  *pbVar1;
  undefined4 uVar2;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
  *pbVar3;
  uint uVar4;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
  bVar5;
  node_type *this_00;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
  **ppbVar6;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
  **ppbVar7;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
  **ppbVar8;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
  *pbVar9;
  ulong uVar10;
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>,_bool>
  *ppVar11;
  uint uVar12;
  btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
  *this_01;
  long lVar13;
  size_type i;
  char *__function;
  ulong uVar14;
  node_type *pnVar15;
  uint uVar16;
  uint uVar17;
  void *pvVar18;
  node_type *node;
  allocator_type *in_R9;
  node_type *i_00;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
  *pbVar19;
  ulong uVar20;
  bool bVar21;
  iterator local_58;
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>,_bool>
  *local_48;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
  *local_40;
  ulong local_38;
  
  uVar14 = (ulong)args_1 & 0xffffffff;
  pvVar18 = this;
  if (*(long *)((long)this + 0x10) == 0) {
    pbVar9 = btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
             ::new_leaf_root_node
                       ((btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                         *)0x1,(int)this);
    *(btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
      **)((long)this + 8) = pbVar9;
    *(btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
      **)this = pbVar9;
  }
  else {
    pbVar9 = *this;
  }
  for (; uVar16 = (uint)pvVar18, ((ulong)pbVar9 & 7) == 0;
      pbVar9 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
               ::child(pbVar9,(size_type)pvVar18)) {
    uVar12 = (uint)(byte)pbVar9[10];
    if (pbVar9[10] ==
        (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
         )0x0) {
      uVar12 = 0;
    }
    else {
      uVar17 = 0;
      do {
        uVar16 = (int)(uVar12 + uVar17) >> 1;
        uVar4 = uVar16;
        if (*(int *)(pbVar9 + (long)(int)uVar16 * 8 + 0xc) < (int)args) {
          uVar17 = uVar16 + 1;
          uVar4 = uVar12;
          uVar16 = uVar17;
        }
        uVar12 = uVar4;
      } while (uVar17 != uVar12);
    }
    this_00 = pbVar9;
    uVar17 = uVar12;
    if (pbVar9[0xb] !=
        (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
         )0x0) goto LAB_001b5384;
    pvVar18 = (void *)(long)(int)uVar12;
  }
  goto LAB_001b56cc;
  while( true ) {
    pbVar3 = *(btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
               **)this_00;
    if (((ulong)pbVar3 & 7) != 0) goto LAB_001b56cc;
    pbVar19 = this_00 + 8;
    this_00 = pbVar3;
    uVar17 = (uint)(byte)*pbVar19;
    if (pbVar3[0xb] !=
        (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
         )0x0) break;
LAB_001b5384:
    if (((ulong)this_00 & 7) != 0) goto LAB_001b56cc;
    if (uVar17 != (byte)this_00[10]) {
      if (*(int *)(this_00 + (long)(int)uVar17 * 8 + 0xc) <= (int)args) {
        ppVar11 = (pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>,_bool>
                   *)0x0;
        goto LAB_001b56b2;
      }
      break;
    }
  }
  local_58.node = pbVar9;
  local_58.position = uVar12;
  if (((ulong)pbVar9 & 7) == 0) {
    bVar5 = (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
             )0x1e;
    if (pbVar9[0xb] !=
        (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
         )0x0) {
      bVar5 = pbVar9[0xb];
    }
    this_00 = pbVar9;
    if (pbVar9[10] == bVar5) {
      if ((byte)bVar5 < 0x1e) {
        if (pbVar9 != *this) {
          __assert_fail("iter.node == root()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xc27,
                        "iterator phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>, Args = <std::pair<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>]"
                       );
        }
        this_01 = (btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                   *)0x1e;
        if ((byte)((char)bVar5 * '\x02') < 0x1e) {
          this_01 = (btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                     *)(ulong)(byte)((char)bVar5 * '\x02');
        }
        this_00 = btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                  ::new_leaf_root_node(this_01,uVar16);
        local_58.node = this_00;
        if ((((ulong)this_00 & 7) != 0) || (pbVar9 = *this, ((ulong)pbVar9 & 7) != 0))
        goto LAB_001b56cc;
        if ((this_00[0xb] != (node_type)0x0) !=
            (pbVar9[0xb] !=
            (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
             )0x0)) {
          __assert_fail("leaf() == x->leaf()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x942,
                        "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>>::swap(btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>]"
                       );
        }
        pbVar19 = this_00;
        pbVar3 = pbVar9;
        if ((byte)this_00[10] <= (byte)pbVar9[10]) {
          pbVar19 = pbVar9;
          pbVar3 = this_00;
        }
        bVar5 = pbVar3[10];
        if (bVar5 == (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                      )0x0) {
          i = 0;
        }
        else {
          lVar13 = 0xc;
          do {
            pbVar1 = pbVar3 + lVar13;
            uVar2 = *(undefined4 *)pbVar1;
            *(undefined4 *)pbVar1 = *(undefined4 *)(pbVar19 + lVar13);
            *(undefined4 *)(pbVar19 + lVar13) = uVar2;
            uVar2 = *(undefined4 *)(pbVar1 + 4);
            *(undefined4 *)(pbVar1 + 4) = *(undefined4 *)(pbVar19 + lVar13 + 4);
            *(undefined4 *)(pbVar19 + lVar13 + 4) = uVar2;
            lVar13 = lVar13 + 8;
          } while (pbVar1 + 8 != pbVar3 + (ulong)(byte)bVar5 * 8 + 0xc);
          i = (size_type)(byte)pbVar3[10];
        }
        node = (node_type *)((byte)pbVar19[10] - i);
        local_40 = pbVar9;
        local_38 = uVar14;
        btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
        ::uninitialized_move_n(pbVar19,(size_type)node,i,i,pbVar3,in_R9);
        if (this_00[0xb] == (node_type)0x0) {
          local_48 = __return_storage_ptr__;
          ppbVar6 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                    ::mutable_child(pbVar3,0);
          ppbVar7 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                    ::mutable_child(pbVar3,(ulong)(byte)pbVar3[10] + 1);
          ppbVar8 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                    ::mutable_child(pbVar19,0);
          for (; ppbVar6 != ppbVar7; ppbVar6 = ppbVar6 + 1) {
            pbVar9 = *ppbVar6;
            *ppbVar6 = *ppbVar8;
            *ppbVar8 = pbVar9;
            ppbVar8 = ppbVar8 + 1;
          }
          pnVar15 = (node_type *)0x0;
          do {
            i_00 = pnVar15;
            pbVar9 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                     ::child(pbVar3,(size_type)i_00);
            if (((ulong)pbVar9 & 7) != 0) {
LAB_001b56eb:
              __function = 
              "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>,..." /* TRUNCATED STRING LITERAL */
              ;
              goto LAB_001b56e1;
            }
            *(btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
              **)pbVar9 = pbVar3;
            node = i_00;
            pbVar9 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                     ::child(pbVar19,(size_type)i_00);
            __return_storage_ptr__ = local_48;
            if (((ulong)pbVar9 & 7) != 0) goto LAB_001b56eb;
            *(btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
              **)pbVar9 = pbVar19;
            pnVar15 = i_00 + 1;
          } while (i_00 < (node_type *)(ulong)(byte)pbVar3[10]);
          if (i_00 < (node_type *)(ulong)(byte)pbVar19[10]) {
            do {
              pbVar9 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                       ::child(pbVar19,(size_type)pnVar15);
              btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
              ::init_child(pbVar3,(int)pnVar15,pbVar9);
              node = pnVar15;
              btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
              ::mutable_child(pbVar19,(size_type)pnVar15);
              bVar21 = pnVar15 < (node_type *)(ulong)(byte)pbVar19[10];
              pnVar15 = pnVar15 + 1;
            } while (bVar21);
          }
        }
        bVar5 = this_00[10];
        this_00[10] = local_40[10];
        local_40[10] = bVar5;
        btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
        ::delete_leaf_node(*this,node);
        *(node_type **)this = this_00;
        *(node_type **)((long)this + 8) = this_00;
        uVar14 = local_38;
      }
      else {
        btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
        ::rebalance_or_split
                  ((btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                    *)this,&local_58);
        this_00 = local_58.node;
      }
    }
    uVar17 = local_58.position;
    if (((ulong)this_00 & 7) == 0) {
      uVar20 = (ulong)local_58.position;
      uVar10 = (ulong)(byte)this_00[10];
      if (uVar10 < uVar20) {
        __assert_fail("i <= count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x852,
                      "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>, Args = <std::pair<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>]"
                     );
      }
      for (; uVar20 < uVar10; uVar10 = uVar10 - 1) {
        *(undefined8 *)(this_00 + uVar10 * 8 + 0xc) = *(undefined8 *)(this_00 + uVar10 * 8 + 4);
      }
      *(ulong *)(this_00 + uVar20 * 8 + 0xc) = (ulong)args & 0xffffffff | uVar14 << 0x20;
      bVar5 = (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
               )((char)this_00[10] + 1);
      this_00[10] = bVar5;
      if (this_00[0xb] ==
          (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
           )0x0) {
        uVar20 = uVar20 + 1;
        if (uVar20 < (byte)bVar5) {
          uVar14 = (ulong)(byte)bVar5;
          if ((uint)uVar20 < (uint)(byte)bVar5) {
            do {
              uVar16 = (int)uVar14 - 1;
              pbVar9 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                       ::child(this_00,(ulong)uVar16);
              btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
              ::set_child(this_00,uVar14,pbVar9);
              uVar14 = (ulong)uVar16;
            } while ((int)(uint)uVar20 < (int)uVar16);
          }
          btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
          ::mutable_child(this_00,uVar20);
        }
      }
      *(long *)((long)this + 0x10) = *(long *)((long)this + 0x10) + 1;
      ppVar11 = (pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>,_bool>
                 *)CONCAT71((int7)((ulong)this >> 8),1);
LAB_001b56b2:
      (__return_storage_ptr__->first).node = this_00;
      (__return_storage_ptr__->first).position = uVar17;
      __return_storage_ptr__->second = SUB81(ppVar11,0);
      return ppVar11;
    }
  }
LAB_001b56cc:
  __function = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>,..." /* TRUNCATED STRING LITERAL */
  ;
LAB_001b56e1:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

std::pair<iterator, bool> emplace(Args &&... args) {
            init_type v(std::forward<Args>(args)...);
            return this->tree_.insert_unique(params_type::key(v), std::move(v));
        }